

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O0

char * Kernel::Ordering::resultToString(Result r)

{
  char *pcVar1;
  Result r_local;
  
  pcVar1 = (char *)(*(code *)(&DAT_00ef9a60 + *(int *)(&DAT_00ef9a60 + (ulong)(r - GREATER) * 4)))()
  ;
  return pcVar1;
}

Assistant:

const char* Ordering::resultToString(Result r)
{
  switch(r) {
  case GREATER:
    return "GREATER";
  case LESS:
    return "LESS";
  case EQUAL:
    return "EQUAL";
  case INCOMPARABLE:
    return "INCOMPARABLE";
  default:
    ASSERTION_VIOLATION;
    return 0;
  }
}